

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O3

bool __thiscall Bipartition::isEmpty(Bipartition *this)

{
  ulong uVar1;
  pointer puVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar2 = (this->partition).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->partition).m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar4 == 0) {
    return true;
  }
  uVar5 = lVar4 >> 3;
  if (*puVar2 == 0) {
    uVar6 = 0;
    do {
      if ((uVar5 + (uVar5 == 0)) - 1 == uVar6) {
        return true;
      }
      uVar1 = uVar6 + 1;
      lVar4 = uVar6 + 1;
      uVar6 = uVar1;
    } while (puVar2[lVar4] == 0);
    if (uVar5 <= uVar1) {
      return true;
    }
  }
  bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all
                    (&this->partition);
  return bVar3;
}

Assistant:

bool Bipartition::isEmpty() {
    return partition.none() || partition.all();
}